

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  TestLog *log;
  RenderContext *context;
  TestContext *testCtx;
  pointer pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pFVar10;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  RandomViewport viewport;
  ScopedLogSection section;
  vector<float,_std::allocator<float>_> texCoord;
  PixelFormat pixelFormat;
  Texture2DView local_310;
  Surface rendered;
  TextureFormat texFmt;
  LodPrecision local_2d4;
  ConstPixelBufferAccess local_2c8;
  IVec4 colorBits;
  undefined1 local_290 [76];
  _func_int **pp_Stack_244;
  size_type local_23c;
  bool bStack_234;
  undefined3 uStack_233;
  CompareMode CStack_230;
  float local_22c;
  undefined8 uStack_220;
  undefined8 local_218;
  LodMode local_210;
  undefined1 local_1f8 [8];
  _func_int **pp_Stack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  float local_1d8;
  anon_union_16_3_1194ccdc_for_v local_1d4 [22];
  TextureFormatInfo fmtInfo;
  long lVar9;
  
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar7 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  dVar8 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar6),0x40,0x40,dVar7 ^ dVar8);
  texFmt = ((*(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar10 = (this->m_cases).
            super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,"Test",(allocator<char> *)&colorBits);
  de::toString<int>((string *)&local_2c8,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoord,"Test ",(allocator<char> *)&local_310);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1f8,(string *)&rendered);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_290);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_290,TEXTURETYPE_2D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((0x3f < viewport.width) && (0x3f < viewport.height)) {
    glu::mapGLSampler((Sampler *)local_1f8,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    local_22c = local_1d8;
    local_23c = local_1e8._M_allocated_capacity;
    bStack_234 = (bool)local_1e8._M_local_buf[8];
    uStack_233 = local_1e8._9_3_;
    CStack_230 = local_1e8._12_4_;
    local_290._68_8_ = local_1f8;
    pp_Stack_244 = pp_Stack_1f0;
    uStack_220 = local_1d4[0]._8_8_;
    local_218 = local_1d4[1]._0_8_;
    local_290._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
    local_210 = LODMODE_EXACT;
    local_290._52_4_ = fmtInfo.lookupBias.m_data[0];
    local_290._56_4_ = fmtInfo.lookupBias.m_data[1];
    local_290._60_4_ = fmtInfo.lookupBias.m_data[2];
    local_290._64_4_ = fmtInfo.lookupBias.m_data[3];
    local_290._36_4_ = fmtInfo.lookupScale.m_data[0];
    local_290._40_4_ = fmtInfo.lookupScale.m_data[1];
    local_290._44_4_ = fmtInfo.lookupScale.m_data[2];
    local_290._48_4_ = fmtInfo.lookupScale.m_data[3];
    local_1f8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::operator<<((ostream *)&pp_Stack_1f0,"Texture coordinates: ");
    tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar10->minCoord);
    std::operator<<((ostream *)&pp_Stack_1f0," -> ");
    tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar10->maxCoord);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar10->minCoord,&pFVar10->maxCoord);
    (**(code **)(lVar9 + 0xb8))(0xde1,pFVar10->texture->m_glTexture);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar9 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar9 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_290);
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f8,&rendered);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f8);
    dVar7 = this->m_minFilter;
    dVar8 = this->m_magFilter;
    iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar6) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar6) + 0x10);
    iVar6 = pixelFormat.redBits;
    iVar2 = pixelFormat.greenBits;
    iVar3 = pixelFormat.blueBits;
    iVar4 = pixelFormat.alphaBits;
    local_2c8.m_format.order = pixelFormat.redBits;
    local_2c8.m_format.type = pixelFormat.greenBits;
    local_2c8.m_size.m_data[0] = pixelFormat.blueBits;
    local_2c8.m_size.m_data[1] = pixelFormat.alphaBits;
    tcu::operator-((tcu *)local_1f8,(Vector<int,_4> *)&local_2c8,
                   (dVar8 != 0x2600 || dVar7 != 0x2600) + 1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_310,0);
    tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1f8,(Vector<int,_4> *)&local_310);
    local_2d4.rule = RULE_OPENGL;
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_1f8);
    local_2d4.derivateBits = 7;
    local_2d4.lodBits = 4;
    tcu::computeFixedPointThreshold((tcu *)&local_310,&colorBits);
    tcu::operator/((tcu *)&local_2c8,(Vector<float,_4> *)&local_310,
                   (Vector<float,_4> *)(local_290 + 0x24));
    local_1e8._8_8_ = CONCAT44(local_2c8.m_format.type,local_2c8.m_format.order);
    local_1d8 = (float)local_2c8.m_size.m_data[0];
    local_1d4[0].uData[0] = local_2c8.m_size.m_data[1];
    local_1f8._0_4_ = ARGB;
    local_1f8._4_4_ = UNORM_SHORT_555;
    pp_Stack_1f0 = (_func_int **)0x500000000;
    local_1e8._M_allocated_capacity = 5;
    local_1d4[0]._4_4_ = CONCAT13(0 < iVar4,CONCAT12(0 < iVar3,CONCAT11(0 < iVar2,0 < iVar6)));
    testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2c8,&rendered);
    local_310.m_numLevels = (pFVar10->texture->m_refTexture).m_view.m_numLevels;
    local_310.m_levels = (pFVar10->texture->m_refTexture).m_view.m_levels;
    bVar5 = glu::TextureTestUtil::verifyTextureResult
                      (testCtx,&local_2c8,&local_310,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                       (LookupPrecision *)local_1f8,&local_2d4,&pixelFormat);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    iVar6 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar6;
    pFVar10 = (this->m_cases).
              super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pFVar1 = (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&rendered);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    return (IterateResult)(iVar6 < (int)(((long)pFVar10 - (long)pFVar1) / 0x18));
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small viewport",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFilteringTests.cpp"
             ,0x113);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_renderCtx.getFunctions();
	const RandomViewport			viewport	(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::TextureFormat		texFmt		= m_textures[0]->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < MIN_VIEWPORT_WIDTH || viewport.height < MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], refParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 7;
		lodPrecision.lodBits			= 4;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(9,9,0); // mediump interpolation
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
											  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}